

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void pzshape::TPZShapePiram::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int node_1;
  int node;
  int iVar9;
  long lVar10;
  int il;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int local_e0;
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  TPZStack<int,_10> lowersides;
  
  if (side < 5) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                 ,0x1c2);
    }
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar5 = 1;
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar5 = 0;
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar5 = 0;
  }
  else if ((uint)side < 0xd) {
    uVar11 = order - 1;
    if (shapeorders->fRows != (long)(int)uVar11) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                 ,0x1cd);
    }
    uVar13 = 0;
    uVar6 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar6 = uVar13;
    }
    for (; uVar6 != uVar13; uVar13 = uVar13 + 1) {
      piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
      *piVar5 = (int)uVar13 + 2;
    }
  }
  else {
    if (side == 0xd) {
      uVar6 = (ulong)(uint)((order + -1) * (order + -1));
      if (shapeorders->fRows != uVar6) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x1d9);
      }
      TPZStack<int,_10>::TPZStack(&lowersides);
      pztopology::TPZPyramid::LowerDimensionSides(0xd,&lowersides);
      TPZStack<int,_10>::Push(&lowersides,0xd);
      iVar2 = pztopology::TPZPyramid::NSideNodes(0xd);
      TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar2);
      for (lVar10 = 0; lVar10 < locid.super_TPZVec<long>.fNElements; lVar10 = lVar10 + 1) {
        iVar2 = pztopology::TPZPyramid::ContainedSideLocId(0xd,(int)lVar10);
        locid.super_TPZVec<long>.fStore[lVar10] = id->fStore[iVar2];
      }
      TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,uVar6,3);
      TPZShapeQuad::SideShapeOrder(8,&locid.super_TPZVec<long>,order,&locshapeorders);
      for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,0);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar5 = iVar2;
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,1);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
        *piVar5 = iVar2;
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,2);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
        *piVar5 = iVar2;
      }
    }
    else {
      iVar2 = order + -2;
      if (0x11 < (uint)side) {
        uVar11 = 0;
        iVar3 = 0;
        if (0 < iVar2) {
          iVar3 = iVar2;
        }
        iVar4 = 1;
        while (iVar4 - iVar3 != 1) {
          uVar11 = uVar11 + ((uint)(iVar4 * (iVar4 + 1)) >> 1);
          iVar4 = iVar4 + 1;
        }
        if (shapeorders->fRows == (ulong)uVar11) {
          iVar12 = 0;
          local_e0 = 3;
          for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
            iVar8 = local_e0;
            for (iVar7 = 0; iVar1 = iVar2, iVar9 = iVar8, iVar7 != iVar2; iVar7 = iVar7 + 1) {
              while (iVar1 != 0) {
                if (iVar9 + -3 < iVar2) {
                  lVar10 = (long)iVar12;
                  piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar10,0);
                  *piVar5 = iVar9;
                  piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar10,1);
                  *piVar5 = iVar9;
                  piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar10,2);
                  *piVar5 = iVar9;
                  iVar12 = iVar12 + 1;
                }
                iVar1 = iVar1 + -1;
                iVar9 = iVar9 + 1;
              }
              iVar8 = iVar8 + 1;
            }
            local_e0 = local_e0 + 1;
          }
          return;
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x220);
      }
      uVar6 = (long)(iVar2 * (order + -1)) / 2;
      iVar2 = (int)uVar6;
      if (shapeorders->fRows != (long)iVar2) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapepiram.cpp"
                   ,0x1fd);
      }
      TPZStack<int,_10>::TPZStack(&lowersides);
      pztopology::TPZPyramid::LowerDimensionSides(side,&lowersides);
      TPZStack<int,_10>::Push(&lowersides,side);
      iVar3 = pztopology::TPZPyramid::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar3);
      for (lVar10 = 0; lVar10 < locid.super_TPZVec<long>.fNElements; lVar10 = lVar10 + 1) {
        iVar3 = pztopology::TPZPyramid::ContainedSideLocId(side,(int)lVar10);
        locid.super_TPZVec<long>.fStore[lVar10] = id->fStore[iVar3];
      }
      TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,(long)iVar2,3);
      TPZShapeTriang::SideShapeOrder(6,&locid.super_TPZVec<long>,order,&locshapeorders);
      uVar13 = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar2 < 1) {
        uVar6 = uVar13;
      }
      for (; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,0);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar5 = iVar2;
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,1);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
        *piVar5 = iVar2;
        piVar5 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,2);
        iVar2 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
        *piVar5 = iVar2;
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&locshapeorders);
    TPZManVector<long,_4>::~TPZManVector(&locid);
    TPZManVector<int,_10>::~TPZManVector(&lowersides.super_TPZManVector<int,_10>);
  }
  return;
}

Assistant:

void TPZShapePiram::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=4)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=5 && side<=12)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 13)
        {
            // quadrilatero
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else if (side >= 14 && side <= 17)
        {
            //triangulos
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {
            // interno
            int totsum = 0;
            for(int i=0;i<order - 2;i++) {
                totsum += (i+1)*(i+2) / 2;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-2;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int soma = i+j+k;
                        if( i+j+k < ord ) // Duvida
                        {
                            shapeorders(count,0) = 3 + soma;
                            shapeorders(count,1) = 3 + soma;
                            shapeorders(count,2) = 3 + soma;
                            count++;
                        }
                    }
                }
            }
        }

    }